

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiStyle::ScaleAllSizes(ImGuiStyle *this,float scale_factor)

{
  ImVec2 *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  ImVec2 IVar2;
  
  operator*(in_RDI,0.0);
  IVar2 = ImFloor(in_RDI);
  *(ImVec2 *)&in_RDI->y = IVar2;
  fVar1 = ImFloor(in_RDI[1].y * in_XMM0_Da);
  in_RDI[1].y = fVar1;
  operator*(in_RDI,0.0);
  IVar2 = ImFloor(in_RDI);
  *(ImVec2 *)&in_RDI[2].y = IVar2;
  fVar1 = ImFloor(in_RDI[4].y * in_XMM0_Da);
  in_RDI[4].y = fVar1;
  fVar1 = ImFloor(in_RDI[5].y * in_XMM0_Da);
  in_RDI[5].y = fVar1;
  operator*(in_RDI,0.0);
  IVar2 = ImFloor(in_RDI);
  *(ImVec2 *)&in_RDI[6].y = IVar2;
  fVar1 = ImFloor(in_RDI[7].y * in_XMM0_Da);
  in_RDI[7].y = fVar1;
  fVar1 = ImFloor(in_RDI[0xe].y * in_XMM0_Da);
  in_RDI[0xe].y = fVar1;
  operator*(in_RDI,0.0);
  IVar2 = ImFloor(in_RDI);
  *(ImVec2 *)&in_RDI[8].y = IVar2;
  operator*(in_RDI,0.0);
  IVar2 = ImFloor(in_RDI);
  *(ImVec2 *)&in_RDI[9].y = IVar2;
  operator*(in_RDI,0.0);
  IVar2 = ImFloor(in_RDI);
  *(ImVec2 *)&in_RDI[10].y = IVar2;
  fVar1 = ImFloor(in_RDI[0xb].y * in_XMM0_Da);
  in_RDI[0xb].y = fVar1;
  fVar1 = ImFloor(in_RDI[0xc].x * in_XMM0_Da);
  in_RDI[0xc].x = fVar1;
  fVar1 = ImFloor(in_RDI[0xc].y * in_XMM0_Da);
  in_RDI[0xc].y = fVar1;
  fVar1 = ImFloor(in_RDI[0xd].x * in_XMM0_Da);
  in_RDI[0xd].x = fVar1;
  fVar1 = ImFloor(in_RDI[0xd].y * in_XMM0_Da);
  in_RDI[0xd].y = fVar1;
  fVar1 = ImFloor(in_RDI[0xe].x * in_XMM0_Da);
  in_RDI[0xe].x = fVar1;
  operator*(in_RDI,0.0);
  IVar2 = ImFloor(in_RDI);
  *(ImVec2 *)&in_RDI[0x10].y = IVar2;
  operator*(in_RDI,0.0);
  IVar2 = ImFloor(in_RDI);
  *(ImVec2 *)&in_RDI[0x11].y = IVar2;
  fVar1 = ImFloor(in_RDI[0x12].y * in_XMM0_Da);
  in_RDI[0x12].y = fVar1;
  return;
}

Assistant:

void ImGuiStyle::ScaleAllSizes(float scale_factor)
{
    WindowPadding = ImFloor(WindowPadding * scale_factor);
    WindowRounding = ImFloor(WindowRounding * scale_factor);
    WindowMinSize = ImFloor(WindowMinSize * scale_factor);
    ChildRounding = ImFloor(ChildRounding * scale_factor);
    PopupRounding = ImFloor(PopupRounding * scale_factor);
    FramePadding = ImFloor(FramePadding * scale_factor);
    FrameRounding = ImFloor(FrameRounding * scale_factor);
    TabRounding = ImFloor(TabRounding * scale_factor);
    ItemSpacing = ImFloor(ItemSpacing * scale_factor);
    ItemInnerSpacing = ImFloor(ItemInnerSpacing * scale_factor);
    TouchExtraPadding = ImFloor(TouchExtraPadding * scale_factor);
    IndentSpacing = ImFloor(IndentSpacing * scale_factor);
    ColumnsMinSpacing = ImFloor(ColumnsMinSpacing * scale_factor);
    ScrollbarSize = ImFloor(ScrollbarSize * scale_factor);
    ScrollbarRounding = ImFloor(ScrollbarRounding * scale_factor);
    GrabMinSize = ImFloor(GrabMinSize * scale_factor);
    GrabRounding = ImFloor(GrabRounding * scale_factor);
    DisplayWindowPadding = ImFloor(DisplayWindowPadding * scale_factor);
    DisplaySafeAreaPadding = ImFloor(DisplaySafeAreaPadding * scale_factor);
    MouseCursorScale = ImFloor(MouseCursorScale * scale_factor);
}